

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSchur.h
# Opt level: O1

RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::RealSchur<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
computeFromHessenberg<Eigen::internal::HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          *matrixH,Matrix<double,__1,__1,_0,__1,__1> *matrixQ,bool computeU)

{
  double *pdVar1;
  bool bVar2;
  double *pdVar3;
  undefined7 in_register_00000009;
  long lVar4;
  ulong uVar5;
  long il;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  Scalar SVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  Scalar exshift;
  Scalar local_b8;
  uint local_b0;
  uint local_ac;
  long local_a8;
  double local_a0;
  Vector3s local_98;
  Scalar *local_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  undefined8 uStack_40;
  
  PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator=
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,
             (ReturnByValue<Eigen::internal::HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)matrixH);
  lVar15 = *(long *)(this + 0x10);
  if (lVar15 < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x130,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x30),lVar15,lVar15,1);
  if ((computeU) &&
     ((*(double **)(this + 0x18) !=
       (matrixQ->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
      || (*(long *)(this + 0x20) !=
          (matrixQ->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows)))) {
    internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)(this + 0x18),matrixQ,
               (assign_op<double,_double> *)&local_98);
  }
  local_a8 = *(long *)(this + 0x88);
  if (local_a8 == -1) {
    if (matrixH->m_hess->m_isInitialized == false) {
      __assert_fail("m_isInitialized && \"HessenbergDecomposition is not initialized.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Eigenvalues/./HessenbergDecomposition.h"
                    ,0xd8,
                    "const MatrixType &Eigen::HessenbergDecomposition<Eigen::Matrix<double, -1, -1>>::packedMatrix() const [_MatrixType = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    local_a8 = (matrixH->m_hess->m_matrix).
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
               0x28;
  }
  local_b0 = (uint)CONCAT71(in_register_00000009,computeU);
  lVar15 = *(long *)(this + 0x10);
  local_80 = *(Scalar **)(this + 0x30);
  local_b8 = 0.0;
  SVar16 = RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::computeNormOfT
                     ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
  lVar14 = 0;
  if ((0 < lVar15) && ((SVar16 != 0.0 || (NAN(SVar16))))) {
    dVar21 = 2.2250738585072014e-308;
    if (2.2250738585072014e-308 <= SVar16 * 4.930380657631324e-32) {
      dVar21 = SVar16 * 4.930380657631324e-32;
    }
    lVar15 = lVar15 + -1;
    lVar6 = 0;
    local_ac = local_b0 & 0xff;
    lVar14 = 0;
    local_a0 = dVar21;
    do {
      pdVar3 = *(double **)this;
      lVar4 = *(long *)(this + 8);
      lVar11 = lVar15;
      do {
        il = lVar11;
        if (il < 1) break;
        lVar7 = (il + -1) * lVar4;
        dVar19 = (ABS(pdVar3[il * lVar4 + il]) + ABS(pdVar3[lVar7 + il + -1])) *
                 2.220446049250313e-16;
        dVar18 = dVar21;
        if (dVar21 <= dVar19) {
          dVar18 = dVar19;
        }
        lVar11 = il + -1;
      } while (dVar18 < ABS(pdVar3[lVar7 + il]));
      if (il == lVar15) {
        pdVar3[lVar4 * lVar15 + lVar15] = pdVar3[lVar4 * lVar15 + lVar15] + local_b8;
        if (0 < lVar15) {
          pdVar3[lVar4 * (lVar15 + -1) + lVar15] = 0.0;
        }
        lVar15 = lVar15 + -1;
LAB_0012207f:
        bVar2 = true;
        lVar6 = 0;
      }
      else {
        lVar11 = lVar15 + -1;
        if (il == lVar11) {
          RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::splitOffTwoRows
                    ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,lVar15,
                     SUB41(local_ac,0),&local_b8);
          lVar15 = lVar15 + -2;
          dVar21 = local_a0;
          goto LAB_0012207f;
        }
        local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [0] = 0.0;
        local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [1] = 0.0;
        local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2] = 0.0;
        dVar18 = pdVar3[lVar4 * lVar15 + lVar15];
        lVar7 = lVar4 * lVar11;
        dVar19 = pdVar3[lVar7 + lVar15 + -1];
        dVar22 = pdVar3[lVar7 + lVar15] * pdVar3[lVar4 * lVar15 + lVar15 + -1];
        if (lVar6 == 0x1e) {
          dVar20 = (dVar19 - dVar18) * 0.5;
          dVar17 = dVar20 * dVar20 + dVar22;
          if (0.0 < dVar17) {
            if (dVar17 < 0.0) {
              uStack_40 = 0;
              local_78 = dVar19;
              dStack_70 = dVar19;
              local_68 = dVar20;
              dStack_60 = dVar19;
              local_58 = dVar18;
              dStack_50 = dVar19;
              local_48 = dVar22;
              dVar17 = sqrt(dVar17);
              dVar20 = local_68;
              dVar21 = local_a0;
              dVar22 = local_48;
              dVar18 = local_58;
              dVar19 = local_78;
            }
            else {
              dVar17 = SQRT(dVar17);
            }
            dVar20 = dVar18 - dVar22 / (dVar20 + (double)(~-(ulong)(dVar19 < dVar18) & (ulong)dVar17
                                                         | (ulong)-dVar17 &
                                                           -(ulong)(dVar19 < dVar18)));
            local_b8 = local_b8 + dVar20;
            dVar22 = 0.964;
            dVar18 = 0.964;
            dVar19 = 0.964;
            if (-1 < lVar15) {
              pdVar3 = *(double **)this;
              lVar7 = *(long *)(this + 8);
              lVar4 = lVar15 + 1;
              do {
                *pdVar3 = *pdVar3 - dVar20;
                pdVar3 = pdVar3 + lVar7 + 1;
                lVar4 = lVar4 + -1;
              } while (lVar4 != 0);
              dVar22 = 0.964;
              dVar18 = 0.964;
              dVar19 = 0.964;
            }
          }
        }
        else if (lVar6 == 10) {
          local_b8 = local_b8 + dVar18;
          if (-1 < lVar15) {
            lVar8 = lVar15 + 1;
            pdVar12 = pdVar3;
            do {
              *pdVar12 = *pdVar12 - dVar18;
              pdVar12 = pdVar12 + lVar4 + 1;
              lVar8 = lVar8 + -1;
            } while (lVar8 != 0);
          }
          dVar18 = ABS(pdVar3[lVar4 * (lVar15 + -2) + lVar15 + -1]) + ABS(pdVar3[lVar7 + lVar15]);
          dVar22 = dVar18 * -0.4375 * dVar18;
          dVar18 = dVar18 * 0.75;
          dVar19 = dVar18;
        }
        bVar2 = lVar14 < local_a8;
        if (lVar14 < local_a8) {
          lVar4 = lVar15 + -2;
          if (il <= lVar4) {
            lVar7 = *(long *)this;
            uVar9 = *(long *)(this + 8) * 8;
            lVar10 = uVar9 * lVar4 + lVar15 * 8 + -8;
            uVar5 = uVar9 ^ 0xfffffffffffffff8;
            lVar11 = lVar11 * uVar9 + lVar15 * 8;
            lVar13 = (lVar15 + -3) * uVar9 + lVar15 * 8 + -0x10;
            lVar8 = lVar4;
            do {
              dVar21 = *(double *)(lVar7 + -8 + lVar10);
              local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[0] = ((dVar18 - dVar21) * (dVar19 - dVar21) + -dVar22) /
                          *(double *)(lVar7 + lVar10) + *(double *)(lVar7 + -0x10 + lVar11);
              local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[1] = ((*(double *)(lVar7 + -8 + lVar11) - dVar21) - (dVar18 - dVar21)) -
                          (dVar19 - dVar21);
              local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[2] = *(double *)(lVar7 + lVar11);
              lVar4 = il;
              if (il == lVar8) break;
              pdVar3 = (double *)(lVar7 + lVar13);
              pdVar12 = (double *)(lVar7 + -8 + lVar13);
              pdVar1 = (double *)(lVar7 + -8 + lVar11);
              lVar10 = lVar10 + uVar5;
              lVar11 = lVar11 + uVar5;
              lVar13 = lVar13 + uVar5;
              lVar4 = lVar8;
              lVar8 = lVar8 + -1;
            } while (local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0] * (ABS(*pdVar1) + ABS(dVar21) + ABS(*pdVar12)) *
                     2.220446049250313e-16 <=
                     ABS((ABS(local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                              m_storage.m_data.array[2]) +
                         ABS(local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array[1])) * *pdVar3));
          }
          RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::performFrancisQRStep
                    ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,il,lVar4,lVar15,
                     SUB41(local_ac,0),&local_98,local_80);
          dVar21 = local_a0;
        }
        lVar6 = lVar6 + 1;
        lVar14 = lVar14 + 1;
      }
    } while ((bVar2) && (-1 < lVar15));
  }
  *(uint *)(this + 0x80) = (uint)(local_a8 < lVar14) * 2;
  this[0x84] = (RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>>)0x1;
  this[0x85] = SUB41(local_b0,0);
  return (RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this;
}

Assistant:

RealSchur<MatrixType>& RealSchur<MatrixType>::computeFromHessenberg(const HessMatrixType& matrixH, const OrthMatrixType& matrixQ,  bool computeU)
{
  using std::abs;

  m_matT = matrixH;
  m_workspaceVector.resize(m_matT.cols());
  if(computeU && !internal::is_same_dense(m_matU,matrixQ))
    m_matU = matrixQ;
  
  Index maxIters = m_maxIters;
  if (maxIters == -1)
    maxIters = m_maxIterationsPerRow * matrixH.rows();
  Scalar* workspace = &m_workspaceVector.coeffRef(0);

  // The matrix m_matT is divided in three parts. 
  // Rows 0,...,il-1 are decoupled from the rest because m_matT(il,il-1) is zero. 
  // Rows il,...,iu is the part we are working on (the active window).
  // Rows iu+1,...,end are already brought in triangular form.
  Index iu = m_matT.cols() - 1;
  Index iter = 0;      // iteration count for current eigenvalue
  Index totalIter = 0; // iteration count for whole matrix
  Scalar exshift(0);   // sum of exceptional shifts
  Scalar norm = computeNormOfT();
  // sub-diagonal entries smaller than considerAsZero will be treated as zero.
  // We use eps^2 to enable more precision in small eigenvalues.
  Scalar considerAsZero = numext::maxi<Scalar>( norm * numext::abs2(NumTraits<Scalar>::epsilon()),
                                                (std::numeric_limits<Scalar>::min)() );

  if(norm!=Scalar(0))
  {
    while (iu >= 0)
    {
      Index il = findSmallSubdiagEntry(iu,considerAsZero);

      // Check for convergence
      if (il == iu) // One root found
      {
        m_matT.coeffRef(iu,iu) = m_matT.coeff(iu,iu) + exshift;
        if (iu > 0)
          m_matT.coeffRef(iu, iu-1) = Scalar(0);
        iu--;
        iter = 0;
      }
      else if (il == iu-1) // Two roots found
      {
        splitOffTwoRows(iu, computeU, exshift);
        iu -= 2;
        iter = 0;
      }
      else // No convergence yet
      {
        // The firstHouseholderVector vector has to be initialized to something to get rid of a silly GCC warning (-O1 -Wall -DNDEBUG )
        Vector3s firstHouseholderVector = Vector3s::Zero(), shiftInfo;
        computeShift(iu, iter, exshift, shiftInfo);
        iter = iter + 1;
        totalIter = totalIter + 1;
        if (totalIter > maxIters) break;
        Index im;
        initFrancisQRStep(il, iu, shiftInfo, im, firstHouseholderVector);
        performFrancisQRStep(il, im, iu, computeU, firstHouseholderVector, workspace);
      }
    }
  }
  if(totalIter <= maxIters)
    m_info = Success;
  else
    m_info = NoConvergence;

  m_isInitialized = true;
  m_matUisUptodate = computeU;
  return *this;
}